

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_no_value_t<cfgfile::string_trait_t>::on_string
          (tag_no_value_t<cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  undefined8 uVar1;
  parser_info_t<cfgfile::string_trait_t> *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  string *in_stack_fffffffffffffd18;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  allocator *__lhs;
  exception_t<cfgfile::string_trait_t> *this_00;
  undefined6 in_stack_fffffffffffffd50;
  undefined1 uVar3;
  allocator in_stack_fffffffffffffd57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  allocator local_241;
  string local_240 [71];
  allocator local_1f9;
  string local_1f8 [71];
  undefined1 local_1b1 [88];
  allocator local_159;
  string local_158 [328];
  parser_info_t<cfgfile::string_trait_t> *local_10;
  
  uVar3 = 1;
  local_10 = in_RSI;
  uVar1 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"Tag \"",&local_159);
  string_trait_t::from_ascii(in_stack_fffffffffffffd18);
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  this_00 = (exception_t<cfgfile::string_trait_t> *)local_1b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1b1 + 1),"\" doesn\'t allow any values. But we\'ve got this: \"",
             (allocator *)this_00);
  string_trait_t::from_ascii(in_stack_fffffffffffffd18);
  std::operator+(in_stack_fffffffffffffd58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd57,CONCAT16(uVar3,in_stack_fffffffffffffd50)));
  std::operator+(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  __lhs = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"\". In file \"",__lhs);
  string_trait_t::from_ascii(in_stack_fffffffffffffd18);
  std::operator+(in_stack_fffffffffffffd58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd57,CONCAT16(uVar3,in_stack_fffffffffffffd50)));
  parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 in_stack_fffffffffffffd20);
  paVar2 = &local_241;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"\" on line ",paVar2);
  string_trait_t::from_ascii(in_stack_fffffffffffffd18);
  std::operator+(in_stack_fffffffffffffd58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd57,CONCAT16(uVar3,in_stack_fffffffffffffd50)));
  parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
  string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffd18);
  std::operator+(in_stack_fffffffffffffd58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd57,CONCAT16(uVar3,in_stack_fffffffffffffd50)));
  paVar2 = (allocator *)&stack0xfffffffffffffd57;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd58,".",paVar2);
  string_trait_t::from_ascii((string *)paVar2);
  std::operator+(in_stack_fffffffffffffd58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd57,CONCAT16(uVar3,in_stack_fffffffffffffd50)));
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,(string_t *)__lhs);
  __cxa_throw(uVar1,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		throw exception_t< Trait >( Trait::from_ascii( "Tag \"" ) +
			this->name() + Trait::from_ascii( "\" doesn't allow any values. "
				"But we've got this: \"" ) +
			str + Trait::from_ascii( "\". In file \"" ) + info.file_name() +
			Trait::from_ascii( "\" on line " ) +
			Trait::to_string( info.line_number() ) +
			Trait::from_ascii( "." ) );
	}